

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t assertion_equal_mem(char *file,wchar_t line,void *_v1,char *e1,void *_v2,char *e2,size_t l,
                           char *ld,void *extra)

{
  int iVar1;
  bool bVar2;
  size_t local_90;
  size_t local_78;
  size_t local_58;
  size_t offset;
  char *v2;
  char *v1;
  char *e2_local;
  void *_v2_local;
  char *e1_local;
  void *_v1_local;
  wchar_t line_local;
  char *file_local;
  
  assertion_count(file,line);
  if (_v1 == _v2) {
LAB_00116368:
    file_local._4_4_ = L'\x01';
  }
  else {
    if ((_v1 != (void *)0x0) && (_v2 != (void *)0x0)) {
      iVar1 = memcmp(_v1,_v2,l);
      if (iVar1 == 0) goto LAB_00116368;
    }
    if ((_v1 == (void *)0x0) || (_v2 == (void *)0x0)) {
      file_local._4_4_ = L'\0';
    }
    else {
      failure_start(file,line,"%s != %s",e1,e2);
      logprintf("      size %s = %d\n",ld,l & 0xffffffff);
      local_58 = 0;
      offset = (size_t)_v2;
      v2 = (char *)_v1;
      while( true ) {
        bVar2 = false;
        if (0x40 < l) {
          iVar1 = memcmp(v2,(void *)offset,0x20);
          bVar2 = iVar1 == 0;
        }
        if (!bVar2) break;
        v2 = v2 + 0x10;
        offset = offset + 0x10;
        l = l - 0x10;
        local_58 = local_58 + 0x10;
      }
      logprintf("      Dump of %s\n",e1);
      if (l < 0x80) {
        local_78 = l;
      }
      else {
        local_78 = 0x80;
      }
      hexdump(v2,(char *)offset,local_78,local_58);
      logprintf("      Dump of %s\n",e2);
      if (l < 0x80) {
        local_90 = l;
      }
      else {
        local_90 = 0x80;
      }
      hexdump((char *)offset,v2,local_90,local_58);
      logprintf("\n");
      failure_finish(extra);
      file_local._4_4_ = L'\0';
    }
  }
  return file_local._4_4_;
}

Assistant:

int
assertion_equal_mem(const char *file, int line,
    const void *_v1, const char *e1,
    const void *_v2, const char *e2,
    size_t l, const char *ld, void *extra)
{
	const char *v1 = (const char *)_v1;
	const char *v2 = (const char *)_v2;
	size_t offset;

	assertion_count(file, line);
	if (v1 == v2 || (v1 != NULL && v2 != NULL && memcmp(v1, v2, l) == 0))
		return (1);
	if (v1 == NULL || v2 == NULL)
		return (0);

	failure_start(file, line, "%s != %s", e1, e2);
	logprintf("      size %s = %d\n", ld, (int)l);
	/* Dump 48 bytes (3 lines) so that the first difference is
	 * in the second line. */
	offset = 0;
	while (l > 64 && memcmp(v1, v2, 32) == 0) {
		/* Two lines agree, so step forward one line. */
		v1 += 16;
		v2 += 16;
		l -= 16;
		offset += 16;
	}
	logprintf("      Dump of %s\n", e1);
	hexdump(v1, v2, l < 128 ? l : 128, offset);
	logprintf("      Dump of %s\n", e2);
	hexdump(v2, v1, l < 128 ? l : 128, offset);
	logprintf("\n");
	failure_finish(extra);
	return (0);
}